

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O0

IterateResult __thiscall glcts::GPUShader5FmaAccuracyTest::iterate(GPUShader5FmaAccuracyTest *this)

{
  GLfloat GVar1;
  GLuint GVar2;
  reference pvVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  LogSection local_670;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  LogSection local_5e0;
  MessageBuilder local_5a0;
  MessageBuilder local_420;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  LogSection local_250;
  MessageBuilder local_210;
  uint local_90;
  float local_8c;
  GLuint i_1;
  GLfloat relative_error_sum_for_float_pass;
  GLfloat relative_error_sum_for_fma_pass;
  GLuint i;
  vector<float,_std::allocator<float>_> relative_errors_for_fma_pass;
  vector<float,_std::allocator<float>_> relative_errors_for_float_pass;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> results_of_fma_pass;
  vector<float,_std::allocator<float>_> results_of_float_pass;
  GPUShader5FmaAccuracyTest *this_local;
  
  initTest(this);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)local_40,10);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10);
  GVar2 = this->m_program_object_id_for_fma_pass;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,0);
  executePass(this,GVar2,pvVar3);
  GVar2 = this->m_program_object_id_for_float_pass;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)
                      &results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,0);
  executePass(this,GVar2,pvVar3);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&relative_error_sum_for_fma_pass);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)&relative_error_sum_for_fma_pass,10);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,10);
  for (relative_error_sum_for_float_pass = 0.0; (uint)relative_error_sum_for_float_pass < 10;
      relative_error_sum_for_float_pass = (GLfloat)((int)relative_error_sum_for_float_pass + 1)) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,
                        (ulong)(uint)relative_error_sum_for_float_pass);
    GVar1 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&relative_error_sum_for_fma_pass,
                        (ulong)(uint)relative_error_sum_for_float_pass);
    calculateRelativeError(this,GVar1,2.71828,pvVar3);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)(uint)relative_error_sum_for_float_pass);
    GVar1 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &relative_errors_for_fma_pass.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (ulong)(uint)relative_error_sum_for_float_pass);
    calculateRelativeError(this,GVar1,2.71828,pvVar3);
  }
  i_1 = 0;
  local_8c = 0.0;
  for (local_90 = 0; local_90 < 10; local_90 = local_90 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&relative_error_sum_for_fma_pass,
                        (ulong)local_90);
    i_1 = (GLuint)(*pvVar3 + (float)i_1);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &relative_errors_for_fma_pass.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
    local_8c = *pvVar3 + local_8c;
  }
  if (local_8c < (float)i_1) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_210,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_210,(char (*) [48])"Routine fma has lower accuracy than a * b + c !")
    ;
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Sum of relative error",&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
    tcu::LogSection::LogSection(&local_250,&local_270,&local_298);
    tcu::TestLog::operator<<(pTVar4,&local_250);
    tcu::LogSection::~LogSection(&local_250);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_420,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_420,(char (*) [11])"fma       ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&i_1);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_420);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_5a0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_5a0,(char (*) [11])"a * b + c ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_8c);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5a0);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(pTVar4,(EndSectionToken *)&tcu::TestLog::EndSection);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"Relative errors",&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"",&local_629);
    tcu::LogSection::LogSection(&local_5e0,&local_600,&local_628);
    tcu::TestLog::operator<<(pTVar4,&local_5e0);
    tcu::LogSection::~LogSection(&local_5e0);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&relative_error_sum_for_fma_pass,0)
    ;
    logArray(this,"fma",pvVar3,10);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &relative_errors_for_fma_pass.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    logArray(this,"a * b + c",pvVar3,10);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(pTVar4,(EndSectionToken *)&tcu::TestLog::EndSection);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Results",&local_691);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_6b9);
    tcu::LogSection::LogSection(&local_670,&local_690,&local_6b8);
    tcu::TestLog::operator<<(pTVar4,&local_670);
    tcu::LogSection::~LogSection(&local_670);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator(&local_6b9);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_40,0);
    logArray(this,"fma",pvVar3,10);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    logArray(this,"a * b + c",pvVar3,10);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(pTVar4,(EndSectionToken *)&tcu::TestLog::EndSection);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&relative_error_sum_for_fma_pass);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GPUShader5FmaAccuracyTest::iterate()
{
	initTest();

	/* Storage space for result values */
	std::vector<glw::GLfloat> results_of_float_pass;
	std::vector<glw::GLfloat> results_of_fma_pass;

	results_of_fma_pass.resize(m_n_draw_call_executions);
	results_of_float_pass.resize(m_n_draw_call_executions);

	/* Execute fma pass */
	executePass(m_program_object_id_for_fma_pass, &results_of_fma_pass[0]);

	/* Execute float pass */
	executePass(m_program_object_id_for_float_pass, &results_of_float_pass[0]);

	/* Storage space for relative errors */
	std::vector<glw::GLfloat> relative_errors_for_float_pass;
	std::vector<glw::GLfloat> relative_errors_for_fma_pass;

	relative_errors_for_fma_pass.resize(m_n_draw_call_executions);
	relative_errors_for_float_pass.resize(m_n_draw_call_executions);

	/* Calculate relative errors */
	for (glw::GLuint i = 0; i < m_n_draw_call_executions; ++i)
	{
		calculateRelativeError(results_of_fma_pass[i], m_expected_result, relative_errors_for_fma_pass[i]);
		calculateRelativeError(results_of_float_pass[i], m_expected_result, relative_errors_for_float_pass[i]);
	}

	/* Sum relative errors */
	glw::GLfloat relative_error_sum_for_fma_pass   = 0.0f;
	glw::GLfloat relative_error_sum_for_float_pass = 0.0f;

	for (glw::GLuint i = 0; i < m_n_draw_call_executions; ++i)
	{
		relative_error_sum_for_fma_pass += relative_errors_for_fma_pass[i];
		relative_error_sum_for_float_pass += relative_errors_for_float_pass[i];
	}

	if (relative_error_sum_for_fma_pass <= relative_error_sum_for_float_pass)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Routine fma has lower accuracy than a * b + c !"
						   << tcu::TestLog::EndMessage;

		/* Log sum of relative errors */
		m_testCtx.getLog() << tcu::TestLog::Section("Sum of relative error", "");
		m_testCtx.getLog() << tcu::TestLog::Message << "fma       " << relative_error_sum_for_fma_pass
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "a * b + c " << relative_error_sum_for_float_pass
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		/* Log relative errors */
		m_testCtx.getLog() << tcu::TestLog::Section("Relative errors", "");
		logArray("fma", &relative_errors_for_fma_pass[0], m_n_draw_call_executions);
		logArray("a * b + c", &relative_errors_for_float_pass[0], m_n_draw_call_executions);
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		/* Log results */
		m_testCtx.getLog() << tcu::TestLog::Section("Results", "");
		logArray("fma", &results_of_fma_pass[0], m_n_draw_call_executions);
		logArray("a * b + c", &results_of_float_pass[0], m_n_draw_call_executions);
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}